

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage5_avx2(__m256i *bf1,__m256i *cospim16,__m256i *cospi48,__m256i *cospi16,
                       __m256i *cospim48,__m256i *clamp_lo,__m256i *clamp_hi,__m256i *rounding,
                       int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong in_XMM0_Qa;
  longlong lVar1;
  longlong in_XMM0_Qb;
  longlong lVar2;
  longlong in_YMM0_H;
  longlong lVar3;
  __m256i *in_register_00001218;
  __m256i *palVar4;
  __m256i *palVar5;
  __m256i *clamp_hi_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  palVar4 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xe][0] = lVar1;
  in_RDI[0xe][1] = lVar2;
  in_RDI[0xe][2] = lVar3;
  in_RDI[0xe][3] = (longlong)in_register_00001218;
  in_RDI[9][0] = in_XMM0_Qa;
  in_RDI[9][1] = in_XMM0_Qb;
  in_RDI[9][2] = in_YMM0_H;
  in_RDI[9][3] = (longlong)palVar4;
  clamp_hi_00 = palVar4;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  palVar5 = palVar4;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[0xd][0] = lVar1;
  in_RDI[0xd][1] = lVar2;
  in_RDI[0xd][2] = lVar3;
  in_RDI[0xd][3] = (longlong)palVar5;
  in_RDI[10][0] = in_XMM0_Qa;
  in_RDI[10][1] = in_XMM0_Qb;
  in_RDI[10][2] = in_YMM0_H;
  in_RDI[10][3] = (longlong)palVar4;
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_03[1] = (longlong)in_RSI;
  in1_03[0] = (longlong)in_RDX;
  in1_03[2] = (longlong)in_RDI;
  in1_03[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_03,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_04[1] = (longlong)in_RSI;
  in1_04[0] = (longlong)in_RDX;
  in1_04[2] = (longlong)in_RDI;
  in1_04[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_04,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_05[1] = (longlong)in_RSI;
  in1_05[0] = (longlong)in_RDX;
  in1_05[2] = (longlong)in_RDI;
  in1_05[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_05,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_06[1] = (longlong)in_RSI;
  in1_06[0] = (longlong)in_RDX;
  in1_06[2] = (longlong)in_RDI;
  in1_06[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_06,in_RCX,in_R8,in_R9,clamp_hi_00);
  return;
}

Assistant:

static inline void idct32_stage5_avx2(
    __m256i *bf1, const __m256i *cospim16, const __m256i *cospi48,
    const __m256i *cospi16, const __m256i *cospim48, const __m256i *clamp_lo,
    const __m256i *clamp_hi, const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim16, &bf1[9], cospi48, &bf1[14], rounding, bit);
  bf1[14] = half_btf_avx2(cospi48, &bf1[9], cospi16, &bf1[14], rounding, bit);
  bf1[9] = temp1;

  temp2 = half_btf_avx2(cospim48, &bf1[10], cospim16, &bf1[13], rounding, bit);
  bf1[13] = half_btf_avx2(cospim16, &bf1[10], cospi48, &bf1[13], rounding, bit);
  bf1[10] = temp2;

  addsub_avx2(bf1[16], bf1[19], bf1 + 16, bf1 + 19, clamp_lo, clamp_hi);
  addsub_avx2(bf1[17], bf1[18], bf1 + 17, bf1 + 18, clamp_lo, clamp_hi);
  addsub_avx2(bf1[23], bf1[20], bf1 + 23, bf1 + 20, clamp_lo, clamp_hi);
  addsub_avx2(bf1[22], bf1[21], bf1 + 22, bf1 + 21, clamp_lo, clamp_hi);
  addsub_avx2(bf1[24], bf1[27], bf1 + 24, bf1 + 27, clamp_lo, clamp_hi);
  addsub_avx2(bf1[25], bf1[26], bf1 + 25, bf1 + 26, clamp_lo, clamp_hi);
  addsub_avx2(bf1[31], bf1[28], bf1 + 31, bf1 + 28, clamp_lo, clamp_hi);
  addsub_avx2(bf1[30], bf1[29], bf1 + 30, bf1 + 29, clamp_lo, clamp_hi);
}